

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.h
# Opt level: O2

void __thiscall MeCab::Mmap<short>::Mmap(Mmap<short> *this)

{
  this->_vptr_Mmap = (_func_int **)&PTR__Mmap_00138fe0;
  this->text = (short *)0x0;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  whatlog::whatlog(&this->what_);
  this->fd = -1;
  return;
}

Assistant:

Mmap(): text(0), fd(-1) {}